

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WFXMLScanner.cpp
# Opt level: O1

void __thiscall xercesc_4_0::WFXMLScanner::scanEndTag(WFXMLScanner *this,bool *gotData)

{
  ReaderMgr *this_00;
  uint uVar1;
  XMLSize_t XVar2;
  XMLDocumentHandler *pXVar3;
  bool bVar4;
  XMLCh XVar5;
  uint *puVar6;
  StackElem *pSVar7;
  XMLCh *pXVar8;
  RuntimeException *this_01;
  
  *gotData = true;
  XVar2 = (this->super_XMLScanner).fElemStack.fStackTop;
  if (XVar2 != 0) {
    if ((this->super_XMLScanner).fDoNamespaces == true) {
      puVar6 = &(this->super_XMLScanner).fElemStack.fStack[XVar2 - 1]->fCurrentURI;
    }
    else {
      puVar6 = &(this->super_XMLScanner).fEmptyNamespaceId;
    }
    uVar1 = *puVar6;
    pSVar7 = ElemStack::popTop(&(this->super_XMLScanner).fElemStack);
    XVar2 = (this->super_XMLScanner).fElemStack.fStackTop;
    this_00 = &(this->super_XMLScanner).fReaderMgr;
    pXVar8 = QName::getRawName(pSVar7->fThisElement->fElementName);
    bVar4 = XMLReader::skippedStringLong((this->super_XMLScanner).fReaderMgr.fCurReader,pXVar8);
    if (bVar4) {
      if (pSVar7->fReaderNum != ((this->super_XMLScanner).fReaderMgr.fCurReader)->fReaderNum) {
        XMLScanner::emitError(&this->super_XMLScanner,PartialTagMarkupError);
      }
      ReaderMgr::skipPastSpaces(this_00);
      bVar4 = ReaderMgr::skippedChar(this_00,L'>');
      if (!bVar4) {
        pXVar8 = QName::getRawName(pSVar7->fThisElement->fElementName);
        XMLScanner::emitError
                  (&this->super_XMLScanner,UnterminatedEndTag,pXVar8,(XMLCh *)0x0,(XMLCh *)0x0,
                   (XMLCh *)0x0);
      }
      pXVar3 = (this->super_XMLScanner).fDocHandler;
      if (pXVar3 != (XMLDocumentHandler *)0x0) {
        (*pXVar3->_vptr_XMLDocumentHandler[6])
                  (pXVar3,pSVar7->fThisElement,(ulong)uVar1,(ulong)(XVar2 == 0),
                   pSVar7->fThisElement->fElementName->fPrefix);
      }
      *gotData = XVar2 != 0;
    }
    else {
      pXVar8 = QName::getRawName(pSVar7->fThisElement->fElementName);
      XMLScanner::emitError
                (&this->super_XMLScanner,ExpectedEndOfTagX,pXVar8,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
      do {
        XVar5 = ReaderMgr::getNextChar(this_00);
        if (XVar5 == L'\0') {
          return;
        }
      } while (XVar5 != L'>');
    }
    return;
  }
  XMLScanner::emitError(&this->super_XMLScanner,MoreEndThanStartTags);
  do {
    XVar5 = ReaderMgr::getNextChar(&(this->super_XMLScanner).fReaderMgr);
    if (XVar5 == L'>') break;
  } while (XVar5 != L'\0');
  this_01 = (RuntimeException *)__cxa_allocate_exception(0x30);
  RuntimeException::RuntimeException
            (this_01,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/WFXMLScanner.cpp"
             ,0x29f,Scan_UnbalancedStartEnd,(this->super_XMLScanner).fMemoryManager);
  __cxa_throw(this_01,&RuntimeException::typeinfo,XMLException::~XMLException);
}

Assistant:

void WFXMLScanner::scanEndTag(bool& gotData)
{
    //  Assume we will still have data until proven otherwise. It will only
    //  ever be false if this is the end of the root element.
    gotData = true;

    //  Check if the element stack is empty. If so, then this is an unbalanced
    //  element (i.e. more ends than starts, perhaps because of bad text
    //  causing one to be skipped.)
    if (fElemStack.isEmpty())
    {
        emitError(XMLErrs::MoreEndThanStartTags);
        fReaderMgr.skipPastChar(chCloseAngle);
        ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::Scan_UnbalancedStartEnd, fMemoryManager);
    }

    //  Pop the stack of the element we are supposed to be ending. Remember
    //  that we don't own this. The stack just keeps them and reuses them.
    unsigned int uriId = (fDoNamespaces)
        ? fElemStack.getCurrentURI() : fEmptyNamespaceId;
    const ElemStack::StackElem* topElem = fElemStack.popTop();

    // See if it was the root element, to avoid multiple calls below
    const bool isRoot = fElemStack.isEmpty();

    // Make sure that its the end of the element that we expect
    if (!fReaderMgr.skippedStringLong(topElem->fThisElement->getFullName()))
    {
        emitError
        (
            XMLErrs::ExpectedEndOfTagX
            , topElem->fThisElement->getFullName()
        );
        fReaderMgr.skipPastChar(chCloseAngle);
        return;
    }

    // Make sure we are back on the same reader as where we started
    if (topElem->fReaderNum != fReaderMgr.getCurrentReaderNum())
        emitError(XMLErrs::PartialTagMarkupError);

    // Skip optional whitespace
    fReaderMgr.skipPastSpaces();

    // Make sure we find the closing bracket
    if (!fReaderMgr.skippedChar(chCloseAngle))
    {
        emitError
        (
            XMLErrs::UnterminatedEndTag
            , topElem->fThisElement->getFullName()
        );
    }

    // If we have a doc handler, tell it about the end tag
    if (fDocHandler)
    {
        fDocHandler->endElement
        (
            *topElem->fThisElement
            , uriId
            , isRoot
            , topElem->fThisElement->getElementName()->getPrefix()
        );
    }

    // If this was the root, then done with content
    gotData = !isRoot;
}